

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

int __thiscall
Protocol::MQTT::V5::Property<unsigned_short>::clone
          (Property<unsigned_short> *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...
          )

{
  Property<unsigned_short> *this_00;
  Property<unsigned_short> *this_local;
  
  this_00 = (Property<unsigned_short> *)operator_new(0x38);
  Property(this_00,(uint)(this->super_PropertyBaseImpl).super_PropertyBase.type,(this->value).value,
           true);
  return (int)this_00;
}

Assistant:

PropertyBase * clone() const { return new Property((PropertyType)type, value.value, true); }